

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveEdge
          (GraphCycles *this,GraphId x,GraphId y)

{
  Node **ppNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  ppNVar1 = (this->rep_->nodes_).ptr_;
  pNVar3 = ppNVar1[x.handle & 0xffffffff];
  if (pNVar3->version != (uint32_t)(x.handle >> 0x20)) {
    pNVar3 = (Node *)0x0;
  }
  pNVar2 = ppNVar1[y.handle & 0xffffffff];
  pNVar4 = (Node *)0x0;
  if (pNVar2->version == (uint32_t)(y.handle >> 0x20)) {
    pNVar4 = pNVar2;
  }
  if ((pNVar3 != (Node *)0x0) && (pNVar4 != (Node *)0x0)) {
    synchronization_internal::anon_unknown_0::NodeSet::erase(&pNVar3->out,(int32_t)y.handle);
    synchronization_internal::anon_unknown_0::NodeSet::erase(&pNVar4->in,(int32_t)x.handle);
    return;
  }
  return;
}

Assistant:

void GraphCycles::RemoveEdge(GraphId x, GraphId y) {
  Node* xn = FindNode(rep_, x);
  Node* yn = FindNode(rep_, y);
  if (xn && yn) {
    xn->out.erase(NodeIndex(y));
    yn->in.erase(NodeIndex(x));
    // No need to update the rank assignment since a previous valid
    // rank assignment remains valid after an edge deletion.
  }
}